

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O1

void ecs_bulk_add_remove_type
               (ecs_world_t *world,ecs_type_t to_add,ecs_type_t to_remove,ecs_filter_t *filter)

{
  ecs_sparse_t *peVar1;
  bool bVar2;
  ecs_world_t *peVar3;
  _Bool _Var4;
  int32_t iVar5;
  ecs_stage_t *peVar6;
  ecs_table_t *table;
  ecs_table_t *peVar7;
  long lVar8;
  int dense_index;
  ecs_entities_t eVar9;
  code *pcStack_90;
  undefined1 auStack_88 [8];
  undefined1 local_80 [8];
  ecs_entities_t to_remove_array;
  ecs_entities_t to_add_array;
  ecs_entities_t added;
  ecs_entities_t removed;
  ecs_world_t *local_38;
  ecs_world_t *world_local;
  
  pcStack_90 = (code *)0x131b9e;
  local_38 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0x6a);
  if (local_38 == (ecs_world_t *)0x0) {
    pcStack_90 = (code *)0x131e49;
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0x6a,
                  "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                 );
  }
  pcStack_90 = (code *)0x131bb5;
  peVar6 = ecs_get_stage(&local_38);
  pcStack_90 = (code *)0x131bee;
  _ecs_assert(peVar6 == &local_38->stage,0x23,(char *)0x0,"stage == &world->stage",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0x6c);
  if (peVar6 != &local_38->stage) {
    pcStack_90 = merge_table;
    __assert_fail("stage == &world->stage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0x6c,
                  "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                 );
  }
  pcStack_90 = (code *)0x131c03;
  eVar9 = ecs_type_to_entities(to_add);
  to_remove_array._8_8_ = eVar9.array;
  to_add_array.array._0_4_ = eVar9.count;
  pcStack_90 = (code *)0x131c13;
  eVar9 = ecs_type_to_entities(to_remove);
  local_80 = (undefined1  [8])eVar9.array;
  to_remove_array.array._0_4_ = eVar9.count;
  to_add_array._8_8_ =
       auStack_88 + -((long)(int32_t)to_add_array.array * 8 + 0xfU & 0xfffffffffffffff0);
  added.array._0_4_ = 0;
  lVar8 = to_add_array._8_8_ - ((long)((int)to_remove_array.array << 3) + 0xfU & 0xfffffffffffffff0)
  ;
  peVar1 = (local_38->store).tables;
  added._8_8_ = lVar8;
  *(undefined8 *)(lVar8 + -8) = 0x131c6a;
  iVar5 = ecs_sparse_count(peVar1);
  if (0 < iVar5) {
    dense_index = 0;
    do {
      peVar1 = (local_38->store).tables;
      *(undefined8 *)(lVar8 + -8) = 0x131c93;
      table = (ecs_table_t *)_ecs_sparse_get(peVar1,0x80,dense_index);
      peVar3 = local_38;
      if ((table->flags & 1) == 0) {
        *(undefined8 *)(lVar8 + -8) = 0x131caf;
        _Var4 = ecs_table_match_filter(peVar3,table,filter);
        peVar3 = local_38;
        if (_Var4) {
          *(undefined8 *)(lVar8 + -8) = 0x131cce;
          peVar7 = ecs_table_traverse_remove
                             (peVar3,table,(ecs_entities_t *)local_80,(ecs_entities_t *)&added.count
                             );
          peVar3 = local_38;
          *(undefined8 *)(lVar8 + -8) = 0x131ce2;
          peVar7 = ecs_table_traverse_add
                             (peVar3,peVar7,(ecs_entities_t *)&to_remove_array.count,
                              (ecs_entities_t *)&to_add_array.count);
          bVar2 = -1 < (int)to_remove_array.array;
          *(undefined8 *)(lVar8 + -8) = 0x131d14;
          _ecs_assert(bVar2,0xc,(char *)0x0,"removed.count <= to_remove_array.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                      ,0x8e);
          if ((int)to_remove_array.array < 0) {
            *(undefined8 *)(lVar8 + -8) = 0x131dec;
            __assert_fail("removed.count <= to_remove_array.count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0x8e,
                          "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                         );
          }
          bVar2 = (int)added.array <= (int32_t)to_add_array.array;
          *(undefined8 *)(lVar8 + -8) = 0x131d48;
          _ecs_assert(bVar2,0xc,(char *)0x0,"added.count <= to_add_array.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                      ,0x8f);
          if ((int32_t)to_add_array.array < (int)added.array) {
            *(undefined8 *)(lVar8 + -8) = 0x131e0b;
            __assert_fail("added.count <= to_add_array.count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0x8f,
                          "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                         );
          }
          if ((table != peVar7) && ((int)added.array != 0)) {
            *(undefined8 *)(lVar8 + -8) = 0x131d8e;
            _ecs_assert(peVar7 != (ecs_table_t *)0x0,0xc,(char *)0x0,"dst_table != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x95);
            peVar3 = local_38;
            if (peVar7 == (ecs_table_t *)0x0) {
              *(undefined8 *)(lVar8 + -8) = 0x131e2a;
              __assert_fail("dst_table != ((void*)0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                            ,0x95,
                            "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                           );
            }
            *(undefined8 *)(lVar8 + -8) = 0x131daa;
            merge_table(peVar3,peVar7,table,(ecs_entities_t *)&to_add_array.count,
                        (ecs_entities_t *)&added.count);
            added.array._0_4_ = 0;
          }
        }
      }
      dense_index = dense_index + 1;
    } while (iVar5 != dense_index);
  }
  return;
}

Assistant:

void ecs_bulk_add_remove_type(
    ecs_world_t *world,
    ecs_type_t to_add,
    ecs_type_t to_remove,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_add_array = ecs_type_to_entities(to_add);
    ecs_entities_t to_remove_array = ecs_type_to_entities(to_remove);

    ecs_entities_t added = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_add_array.count),
        .count = 0
    }; 

    ecs_entities_t removed = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_remove_array.count),
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }

        ecs_table_t *dst_table = ecs_table_traverse_remove(
            world, table, &to_remove_array, &removed);
        
        dst_table = ecs_table_traverse_add(
            world, dst_table, &to_add_array, &added);

        ecs_assert(removed.count <= to_remove_array.count, ECS_INTERNAL_ERROR, NULL);
        ecs_assert(added.count <= to_add_array.count, ECS_INTERNAL_ERROR, NULL);

        if (table == dst_table || (!added.count && !removed.count)) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);   

        merge_table(world, dst_table, table, &added, &removed);
        added.count = 0;
        removed.count = 0;
    }    
}